

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O1

string * license::LicenseGenerator::normalize_date(string *__return_storage_ptr__,string *sDate)

{
  string *psVar1;
  ostream oVar2;
  int iVar3;
  ostream *poVar4;
  invalid_argument *this;
  undefined8 *puVar5;
  bool bVar6;
  ulong uVar7;
  ostream *poVar8;
  uint day;
  uint month;
  uint year;
  ostringstream oss;
  undefined1 local_1bc [4];
  undefined1 local_1b8 [4];
  undefined1 local_1b4 [4];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  if (sDate->_M_string_length < 8) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Date string too small for known formats");
  }
  else {
    puVar5 = &formats_abi_cxx11_;
    bVar6 = false;
    uVar7 = 0;
    while (iVar3 = __isoc99_sscanf((sDate->_M_dataplus)._M_p,*puVar5,local_1b4,local_1b8,local_1bc),
          iVar3 != 3) {
      if (1 < uVar7) goto LAB_0028d4ef;
      uVar7 = uVar7 + 1;
      puVar5 = puVar5 + 4;
    }
    bVar6 = true;
LAB_0028d4ef:
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      psVar1 = local_1b0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
      poVar8 = poVar4 + *(long *)(*(long *)poVar4 + -0x18);
      if (poVar4[*(long *)(*(long *)poVar4 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar8);
        poVar8[0xe0] = oVar2;
        poVar8[0xe1] = (ostream)0x1;
      }
      poVar8[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
      poVar8 = poVar4 + *(long *)(*(long *)poVar4 + -0x18);
      if (poVar4[*(long *)(*(long *)poVar4 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar8);
        poVar8[0xe0] = oVar2;
        poVar8[0xe1] = (ostream)0x1;
      }
      poVar8[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      return psVar1;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Date string did not match a known format");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LicenseGenerator::normalize_date(const std::string& sDate) {
	if(sDate.size()<8)
		throw invalid_argument("Date string too small for known formats");
	unsigned int year, month, day;
	bool found = false;
	for (size_t i = 0; i < formats_n && !found; ++i) {
		const int chread = sscanf(sDate.c_str(),formats[i].c_str(),&year,&month,&day);
		if(chread==3) {
			found = true;
			break;
		}
	}
	if(!found)
		throw invalid_argument("Date string did not match a known format");
	ostringstream oss;
	oss << year << "-" << setfill('0') << std::setw(2) << month << "-" << setfill('0') << std::setw(2) << day;
	return oss.str();
}